

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O0

err_t brngCTRRand(void *buf,size_t count,octet *key,octet *iv)

{
  bool_t bVar1;
  octet *iv_00;
  void *in_RCX;
  octet *in_RDX;
  octet *in_RSI;
  void *in_RDI;
  void *unaff_retaddr;
  void *state;
  void *in_stack_ffffffffffffffc8;
  
  bVar1 = memIsValid(in_RDX,0x20);
  if (((bVar1 != 0) && (bVar1 = memIsValid(in_RCX,0x20), bVar1 != 0)) &&
     (bVar1 = memIsValid(in_RDI,(size_t)in_RSI), bVar1 != 0)) {
    brngCTR_keep();
    iv_00 = (octet *)blobCreate((size_t)in_stack_ffffffffffffffc8);
    if (iv_00 == (octet *)0x0) {
      return 0x6e;
    }
    brngCTRStart(in_RDI,in_RSI,in_RDX);
    brngCTRStepR(iv,(size_t)state,unaff_retaddr);
    brngCTRStepG(iv_00,in_stack_ffffffffffffffc8);
    blobClose((blob_t)0x14fdf3);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t brngCTRRand(void* buf, size_t count, const octet key[32], octet iv[32])
{
	void* state;
	// проверить входные данные
	if (!memIsValid(key, 32) ||
		!memIsValid(iv, 32) ||
		!memIsValid(buf, count))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(brngCTR_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// сгенерировать данные
	brngCTRStart(state, key, iv);
	brngCTRStepR(buf, count, state);
	brngCTRStepG(iv, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}